

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O1

void __thiscall
CaDiCaL::Proof::add_derived_clause
          (Proof *this,Clause *c,vector<unsigned_long,_std::allocator<unsigned_long>_> *chain)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  iterator __position;
  pointer puVar4;
  iterator __position_00;
  uint uVar5;
  unsigned_long *cid;
  pointer __args;
  Clause *__range1;
  long lVar6;
  int local_3c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  
  iVar1 = c->size;
  local_38 = chain;
  if ((long)iVar1 != 0) {
    lVar6 = 0;
    do {
      uVar2 = *(uint *)((long)&c[1].field_0 + lVar6);
      uVar5 = -uVar2;
      if (0 < (int)uVar2) {
        uVar5 = uVar2;
      }
      iVar3 = (this->internal->i2e).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5];
      local_3c = -iVar3;
      if (-1 < (int)uVar2) {
        local_3c = iVar3;
      }
      __position._M_current =
           (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->clause,__position,&local_3c);
      }
      else {
        *__position._M_current = local_3c;
        (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = __position._M_current + 1;
      }
      lVar6 = lVar6 + 4;
    } while ((long)iVar1 * 4 != lVar6);
  }
  __args = (local_38->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (local_38->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (__args != puVar4) {
    do {
      __position_00._M_current =
           (this->proof_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->proof_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->proof_chain,
                   __position_00,__args);
      }
      else {
        *__position_00._M_current = *__args;
        (this->proof_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
      __args = __args + 1;
    } while (__args != puVar4);
  }
  this->clause_id = (uint64_t)c->field_0;
  this->redundant = (bool)((byte)(*(uint *)&c->field_0x8 >> 0xb) & 1);
  add_derived_clause(this);
  return;
}

Assistant:

void Proof::add_derived_clause (Clause *c, const vector<uint64_t> &chain) {
  LOG (c, "PROOF adding to proof derived");
  assert (clause.empty ());
  assert (proof_chain.empty ());
  add_literals (c);
  for (const auto &cid : chain)
    proof_chain.push_back (cid);
  clause_id = c->id;
  redundant = c->redundant;
  add_derived_clause ();
}